

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O2

int FeederBigTriangle(void)

{
  DWORD DVar1;
  int iVar2;
  DWORD DVar3;
  FILE *__stream;
  ulong uVar4;
  ulong uVar5;
  int i;
  uint uVar6;
  
  __stream = fopen("in.txt","w");
  if (__stream != (FILE *)0x0) {
    printf("Creating big triangle... ");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fprintf(__stream,"%d\n",100000);
    fprintf(__stream,"%d %d\n",0x80000000,0x80000000);
    uVar6 = 0;
    do {
      if (uVar6 == 99999) {
        DVar3 = GetTickCount();
        uVar6 = RoundUptoThousand(DVar3 - DVar1);
        printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ",(ulong)uVar6 / 1000,
               (ulong)uVar6 % 1000);
        LabTimeout = uVar6 * 2 + 2000;
        LabMemoryLimit = 1;
        fflush(_stdout);
        fclose(__stream);
        return 0;
      }
      uVar4 = 0x7fffffff;
      if (bigTrianglesN == 2) {
        uVar5 = (ulong)(uVar6 ^ 0x7fffffff);
      }
      else {
        if (bigTrianglesN == 1) {
          uVar4 = (ulong)(uVar6 ^ 0x7fffffff);
        }
        uVar5 = 0x7fffffff;
      }
      iVar2 = fprintf(__stream,"%d %d\n",uVar5,uVar4);
      uVar6 = uVar6 + 1;
    } while (1 < iVar2);
    fclose(__stream);
  }
  puts("can\'t create in.txt. No space on disk?");
  return -1;
}

Assistant:

static int FeederBigTriangle(void)
{
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }

    printf("Creating big triangle... ");
    fflush(stdout);
    DWORD t = GetTickCount();
    fprintf(in, "%d\n", MAX_POINT_COUNT);
    fprintf(in, "%d %d\n", INT_MIN, INT_MIN);

    for (int i = 0; i < MAX_POINT_COUNT - 1; ++i) {
        int x = INT_MAX;
        int y = INT_MAX;
        if (bigTrianglesN == 1) {
            y -= i;
        }
        else if (bigTrianglesN == 2) {
            x -= i;
        }

        if (fprintf(in, "%d %d\n", x, y) < 2) {
            fclose(in);
            printf("can't create in.txt. No space on disk?\n");
            return -1;
        }
    }

    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ", (unsigned)t/1000);
    LabTimeout = (int)t*2+2000;
    LabMemoryLimit = MIN_PROCESS_RSS_BYTES + 3*sizeof(TPoint)*MAX_POINT_COUNT;
    fflush(stdout);
    fclose(in);

    return 0;    
}